

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O0

void __thiscall
Diligent::HashCombiner<Diligent::DefaultHasher,_Diligent::TextureViewDesc>::operator()
          (HashCombiner<Diligent::DefaultHasher,_Diligent::TextureViewDesc> *this,
          TextureViewDesc *TexViewDesc)

{
  DefaultHasher *this_00;
  ushort uVar1;
  Uint32 local_24;
  uint local_20;
  uint local_1c;
  TextureViewDesc *local_18;
  TextureViewDesc *TexViewDesc_local;
  HashCombiner<Diligent::DefaultHasher,_Diligent::TextureViewDesc> *this_local;
  
  this_00 = (this->super_HashCombinerBase<Diligent::DefaultHasher>).m_Hasher;
  local_1c._0_1_ = TexViewDesc->ViewType;
  local_1c._1_1_ = TexViewDesc->TextureDim;
  local_1c._2_2_ = TexViewDesc->Format;
  uVar1._0_1_ = TexViewDesc->AccessFlags;
  uVar1._1_1_ = TexViewDesc->Flags;
  local_20 = (uint)uVar1;
  local_18 = TexViewDesc;
  TexViewDesc_local = (TextureViewDesc *)this;
  local_24 = TextureComponentMapping::AsUint32(&TexViewDesc->Swizzle);
  DefaultHasher::operator()
            (this_00,&local_1c,&TexViewDesc->MostDetailedMip,&TexViewDesc->NumMipLevels,
             &(TexViewDesc->field_5).FirstArraySlice,&(TexViewDesc->field_6).NumArraySlices,
             &local_20,&local_24);
  return;
}

Assistant:

void operator()(const TextureViewDesc& TexViewDesc) const
    {
        ASSERT_SIZEOF(TexViewDesc.ViewType, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(TexViewDesc.TextureDim, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(TexViewDesc.Format, 2, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(TexViewDesc.AccessFlags, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(TexViewDesc.Flags, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(TexViewDesc.Swizzle, 4, "Hash logic below may be incorrect.");

        // Ignore Name. This is consistent with the operator==
        this->m_Hasher(
            ((static_cast<uint32_t>(TexViewDesc.ViewType) << 0u) |
             (static_cast<uint32_t>(TexViewDesc.TextureDim) << 8u) |
             (static_cast<uint32_t>(TexViewDesc.Format) << 16u)),
            TexViewDesc.MostDetailedMip,
            TexViewDesc.NumMipLevels,
            TexViewDesc.FirstArraySlice,
            TexViewDesc.NumArraySlices,
            ((static_cast<uint32_t>(TexViewDesc.AccessFlags) << 0u) |
             (static_cast<uint32_t>(TexViewDesc.Flags) << 8u)),
            TexViewDesc.Swizzle.AsUint32());
        ASSERT_SIZEOF64(TexViewDesc, 40, "Did you add new members to TextureViewDesc? Please handle them here.");
    }